

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<std::__cxx11::string>
          (string *__return_storage_ptr__,OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  char *__s;
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  char *local_28;
  char *value;
  char *name_local;
  OgreXmlSerializer *this_local;
  char *__s_00;
  
  value = name;
  name_local = (char *)this;
  this_local = (OgreXmlSerializer *)__return_storage_ptr__;
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,name);
  __s = value;
  __s_00 = (char *)CONCAT44(extraout_var,iVar1);
  local_28 = __s_00;
  if (__s_00 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s_00,&local_29);
    std::allocator<char>::~allocator(&local_29);
    return __return_storage_ptr__;
  }
  reader = this->m_reader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  ThrowAttibuteError(reader,&local_60,&local_88);
}

Assistant:

std::string OgreXmlSerializer::ReadAttribute<std::string>(const char *name) const
{
    const char* value = m_reader->getAttributeValue(name);
    if (value)
    {
        return std::string(value);
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
        return "";
    }
}